

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_regex(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__s;
  size_t sVar5;
  ushort **ppuVar6;
  char *unaff_R12;
  long lVar7;
  char *unaff_R14;
  char *unaff_R15;
  size_t len;
  undefined1 auStack_b0 [12];
  undefined1 auStack_a4 [12];
  undefined8 uStack_98;
  undefined1 auStack_6c [12];
  undefined1 auStack_60 [8];
  undefined8 uStack_58;
  code *pcStack_50;
  undefined1 auStack_48 [8];
  undefined8 uStack_40;
  code *pcStack_38;
  undefined1 auStack_30 [8];
  undefined8 uStack_28;
  code *pcStack_20;
  undefined1 auStack_18 [8];
  
  pcStack_20 = (code *)0x12d664;
  uVar3 = bson_new();
  pcStack_20 = (code *)0x12d689;
  cVar1 = bson_append_regex(uVar3,"regex",0xffffffff,"^abcd","xi");
  if (cVar1 == '\0') {
    pcStack_20 = (code *)0x12d7a5;
    test_bson_as_json_regex_cold_1();
LAB_0012d7a5:
    pcStack_20 = (code *)0x12d7aa;
    test_bson_as_json_regex_cold_2();
LAB_0012d7aa:
    pcStack_20 = (code *)0x12d7af;
    test_bson_as_json_regex_cold_3();
LAB_0012d7af:
    pcStack_20 = (code *)0x12d7b4;
    test_bson_as_json_regex_cold_4();
LAB_0012d7b4:
    pcStack_20 = (code *)0x12d7b9;
    test_bson_as_json_regex_cold_5();
LAB_0012d7b9:
    pcStack_20 = (code *)0x12d7be;
    test_bson_as_json_regex_cold_6();
  }
  else {
    pcStack_20 = (code *)0x12d6b3;
    cVar1 = bson_append_regex(uVar3,"escaping",0xffffffff,"^\"","");
    if (cVar1 == '\0') goto LAB_0012d7a5;
    pcStack_20 = (code *)0x12d6dd;
    cVar1 = bson_append_regex(uVar3,"ordered",0xffffffff,"^abcd","ilmsux");
    if (cVar1 == '\0') goto LAB_0012d7aa;
    pcStack_20 = (code *)0x12d707;
    cVar1 = bson_append_regex(uVar3,"unordered",0xffffffff,"^abcd","xusmli");
    if (cVar1 == '\0') goto LAB_0012d7af;
    pcStack_20 = (code *)0x12d731;
    cVar1 = bson_append_regex(uVar3,"duplicate",0xffffffff,"^abcd","mmiii");
    if (cVar1 == '\0') goto LAB_0012d7b4;
    pcStack_20 = (code *)0x12d757;
    cVar1 = bson_append_regex(uVar3,"unsupported",0xffffffff,"^abcd","jkmlvz");
    if (cVar1 == '\0') goto LAB_0012d7b9;
    pcStack_20 = (code *)0x12d766;
    unaff_R14 = (char *)bson_as_json(uVar3,auStack_18);
    if (unaff_R14 ==
        "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
       ) {
LAB_0012d788:
      pcStack_20 = (code *)0x12d790;
      bson_free(unaff_R14);
      pcStack_20 = (code *)0x12d798;
      bson_destroy(uVar3);
      return;
    }
    pcStack_20 = (code *)0x12d784;
    iVar2 = strcmp(unaff_R14,
                   "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
                  );
    if (iVar2 == 0) goto LAB_0012d788;
  }
  pcStack_20 = test_bson_as_json_symbol;
  test_bson_as_json_regex_cold_7();
  pcStack_38 = (code *)0x12d7cf;
  uStack_28 = uVar3;
  pcStack_20 = (code *)unaff_R14;
  uVar3 = bson_new();
  pcStack_38 = (code *)0x12d7f3;
  cVar1 = bson_append_symbol(uVar3,"symbol",0xffffffff,"foo",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_38 = (code *)0x12d866;
    test_bson_as_json_symbol_cold_1();
LAB_0012d866:
    pcStack_38 = (code *)0x12d86b;
    test_bson_as_json_symbol_cold_2();
  }
  else {
    pcStack_38 = (code *)0x12d818;
    cVar1 = bson_append_symbol(uVar3,"escaping",0xffffffff,"\"bar\"",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d866;
    pcStack_38 = (code *)0x12d827;
    unaff_R14 = (char *)bson_as_json(uVar3,auStack_30);
    if (unaff_R14 == "{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }") {
LAB_0012d849:
      pcStack_38 = (code *)0x12d851;
      bson_free(unaff_R14);
      pcStack_38 = (code *)0x12d859;
      bson_destroy(uVar3);
      return;
    }
    pcStack_38 = (code *)0x12d845;
    iVar2 = strcmp(unaff_R14,"{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }");
    if (iVar2 == 0) goto LAB_0012d849;
  }
  pcStack_38 = test_bson_as_json_utf8;
  test_bson_as_json_symbol_cold_3();
  pcStack_50 = (code *)0x12d87c;
  uStack_40 = uVar3;
  pcStack_38 = (code *)unaff_R14;
  uVar3 = bson_new();
  pcStack_50 = (code *)0x12d89c;
  cVar1 = bson_append_utf8(uVar3,anon_var_dwarf_49b7,0xffffffff,anon_var_dwarf_49b7,0xffffffff);
  if (cVar1 == '\0') {
    pcStack_50 = (code *)0x12d8de;
    test_bson_as_json_utf8_cold_1();
  }
  else {
    pcStack_50 = (code *)0x12d8ab;
    unaff_R14 = (char *)bson_as_json(uVar3,auStack_48);
    pcStack_50 = (code *)0x12d8bd;
    iVar2 = strcmp(unaff_R14,anon_var_dwarf_19c2f);
    if (iVar2 == 0) {
      pcStack_50 = (code *)0x12d8c9;
      bson_free(unaff_R14);
      pcStack_50 = (code *)0x12d8d1;
      bson_destroy(uVar3);
      return;
    }
  }
  pcStack_50 = test_bson_as_json_dbpointer;
  test_bson_as_json_utf8_cold_2();
  uStack_58 = uVar3;
  pcStack_50 = (code *)unaff_R14;
  bson_oid_init_from_string(auStack_6c,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"dbpointer",0xffffffff,"collection",auStack_6c);
  if (cVar1 == '\0') {
    test_bson_as_json_dbpointer_cold_1();
  }
  else {
    cVar1 = bson_append_dbpointer(uVar3,"escaping",0xffffffff,"\"coll\"",auStack_6c);
    if (cVar1 != '\0') {
      pcVar4 = (char *)bson_as_json(uVar3,auStack_60);
      if (pcVar4 == 
          "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
         ) {
LAB_0012d97b:
        bson_free(pcVar4);
        bson_destroy(uVar3);
        return;
      }
      iVar2 = strcmp(pcVar4,
                     "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
                    );
      if (iVar2 == 0) goto LAB_0012d97b;
      goto LAB_0012d99d;
    }
  }
  test_bson_as_json_dbpointer_cold_2();
LAB_0012d99d:
  test_bson_as_json_dbpointer_cold_3();
  uStack_98 = uVar3;
  bson_oid_init_from_string(auStack_a4,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"p",1,"coll",auStack_a4);
  if (cVar1 == '\0') {
    test_bson_as_canonical_extended_json_dbpointer_cold_1();
  }
  else {
    __s = (char *)bson_as_canonical_extended_json(uVar3,auStack_b0);
    sVar5 = strlen(__s);
    unaff_R15 = (char *)bson_malloc0(sVar5 + 1);
    unaff_R12 = (char *)bson_malloc0(0x62);
    lVar7 = 0;
    ppuVar6 = __ctype_b_loc();
    pcVar4 = __s;
    do {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      unaff_R15[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (*pcVar4 != '\0');
    pcVar4 = 
    "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : \"coll\", \"$id\" : { \"$oid\" : \"12341234123412abcdababcd\" } } } }"
    ;
    lVar7 = 0;
    do {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      unaff_R12[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (*pcVar4 != '\0');
    iVar2 = strcmp(unaff_R15,unaff_R12);
    if (iVar2 == 0) {
      bson_free(unaff_R15);
      bson_free(unaff_R12);
      bson_free(__s);
      bson_destroy(uVar3);
      return;
    }
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n%s:%d  %s()\n",unaff_R15,unaff_R12,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x284,"test_bson_as_canonical_extended_json_dbpointer");
  abort();
}

Assistant:

static void
test_bson_as_json_regex (void)
{
   bson_t *b;
   char *str;
   size_t len;

   b = bson_new ();
   BSON_ASSERT (bson_append_regex (b, "regex", -1, "^abcd", "xi"));
   BSON_ASSERT (bson_append_regex (b, "escaping", -1, "^\"", ""));
   BSON_ASSERT (bson_append_regex (b, "ordered", -1, "^abcd", "ilmsux"));
   BSON_ASSERT (bson_append_regex (b, "unordered", -1, "^abcd", "xusmli"));
   BSON_ASSERT (bson_append_regex (b, "duplicate", -1, "^abcd", "mmiii"));
   BSON_ASSERT (bson_append_regex (b, "unsupported", -1, "^abcd", "jkmlvz"));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ix\" },"
                  " \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" "
                  ": \"\" },"
                  " \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ilmsux\" },"
                  " \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ilmsux\" },"
                  " \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"im\" },"
                  " \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"lm\" } }");

   bson_free (str);
   bson_destroy (b);
}